

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

void __thiscall Instance::enforceConstraints(Instance *this)

{
  ast *paVar1;
  ast *s;
  expr constraint;
  ast aStack_38;
  
  paVar1 = &((this->constraints).super__Vector_base<z3::expr,_std::allocator<z3::expr>_>._M_impl.
             super__Vector_impl_data._M_finish)->super_ast;
  for (s = &((this->constraints).super__Vector_base<z3::expr,_std::allocator<z3::expr>_>._M_impl.
             super__Vector_impl_data._M_start)->super_ast; s != paVar1; s = s + 1) {
    z3::ast::ast(&aStack_38,s);
    z3::optimize::add(&this->solver,(expr *)&aStack_38);
    z3::ast::~ast(&aStack_38);
  }
  (*this->_vptr_Instance[2])(this);
  (*this->_vptr_Instance[1])(this);
  minimizeVss(this);
  return;
}

Assistant:

void Instance::enforceConstraints() {
  for (expr constraint : constraints)
    solver.add(constraint);

  enforceStopConstraint();
  enforceBoundaryConstraints();
  minimizeVss();
}